

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

int fsg_search_start(ps_search_t *search)

{
  fsg_pnode_ctxt_t rc;
  undefined1 local_30 [8];
  fsg_pnode_ctxt_t ctxt;
  int32 silcipid;
  fsg_search_t *fsgs;
  ps_search_t *search_local;
  
  *(undefined4 *)((long)&search[1].d2p + 4) = 0x3f800000;
  *(undefined4 *)&search[1].hyp_str = *(undefined4 *)&search[1].dict;
  *(undefined4 *)((long)&search[1].hyp_str + 4) = *(undefined4 *)((long)&search[1].dict + 4);
  *(undefined4 *)&search[1].dag = *(undefined4 *)&search[1].d2p;
  ctxt.bv[3] = bin_mdef_ciphone_id(search->acmod->mdef,"SIL");
  if (search[1].config != (cmd_ln_t *)0x0) {
    __assert_fail("fsgs->pnode_active == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0x315,"int fsg_search_start(ps_search_t *)");
  }
  if (search[1].acmod == (acmod_t *)0x0) {
    fsg_history_reset((fsg_history_t *)search[1].pls);
    fsg_history_utt_start((fsg_history_t *)search[1].pls);
    *(undefined1 *)&search[1].n_words = 0;
    fsg_pnode_add_all_ctxt((fsg_pnode_ctxt_t *)local_30);
    search[1].post = -1;
    search[1].silence_wid = 0;
    rc.bv[2] = ctxt.bv[0];
    rc.bv[3] = ctxt.bv[1];
    rc.bv[0] = local_30._0_4_;
    rc.bv[1] = local_30._4_4_;
    fsg_history_entry_add((fsg_history_t *)search[1].pls,(fsg_link_t *)0x0,-1,0,-1,ctxt.bv[3],rc);
    search[1].finish_wid = 0;
    fsg_search_null_prop((fsg_search_t *)search);
    fsg_search_word_trans((fsg_search_t *)search);
    search[1].config = (cmd_ln_t *)search[1].acmod;
    search[1].acmod = (acmod_t *)0x0;
    search[1].post = search[1].post + 1;
    *(undefined4 *)((long)&search[2].vt + 4) = 0;
    *(undefined4 *)&search[2].type = 0;
    ptmr_reset((ptmr_t *)&search[2].name);
    ptmr_start((ptmr_t *)&search[2].name);
    return 0;
  }
  __assert_fail("fsgs->pnode_active_next == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x316,"int fsg_search_start(ps_search_t *)");
}

Assistant:

int
fsg_search_start(ps_search_t *search)
{
    fsg_search_t *fsgs = (fsg_search_t *)search;
    int32 silcipid;
    fsg_pnode_ctxt_t ctxt;

    /* Reset dynamic adjustment factor for beams */
    fsgs->beam_factor = 1.0f;
    fsgs->beam = fsgs->beam_orig;
    fsgs->pbeam = fsgs->pbeam_orig;
    fsgs->wbeam = fsgs->wbeam_orig;

    silcipid = bin_mdef_ciphone_id(ps_search_acmod(fsgs)->mdef, "SIL");

    /* Initialize EVERYTHING to be inactive */
    assert(fsgs->pnode_active == NULL);
    assert(fsgs->pnode_active_next == NULL);

    fsg_history_reset(fsgs->history);
    fsg_history_utt_start(fsgs->history);
    fsgs->final = FALSE;

    /* Dummy context structure that allows all right contexts to use this entry */
    fsg_pnode_add_all_ctxt(&ctxt);

    /* Create dummy history entry leading to start state */
    fsgs->frame = -1;
    fsgs->bestscore = 0;
    fsg_history_entry_add(fsgs->history,
                          NULL, -1, 0, -1, silcipid, ctxt);
    fsgs->bpidx_start = 0;

    /* Propagate dummy history entry through NULL transitions from start state */
    fsg_search_null_prop(fsgs);

    /* Perform word transitions from this dummy history entry */
    fsg_search_word_trans(fsgs);

    /* Make the next-frame active list the current one */
    fsgs->pnode_active = fsgs->pnode_active_next;
    fsgs->pnode_active_next = NULL;

    ++fsgs->frame;

    fsgs->n_hmm_eval = 0;
    fsgs->n_sen_eval = 0;

    ptmr_reset(&fsgs->perf);
    ptmr_start(&fsgs->perf);

    return 0;
}